

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>::reallocateAndGrow
          (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this,
          GrowthPosition where,qsizetype n,
          QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  undefined1 *puVar3;
  bool bVar4;
  QString *pQVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  QString *pQVar8;
  qsizetype qVar9;
  NamespaceDeclaration *pNVar10;
  NamespaceDeclaration *pNVar11;
  long lVar12;
  long lVar13;
  NamespaceDeclaration *pNVar14;
  long in_FS_OFFSET;
  QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x0 &&
      where == GrowsAtEnd) {
    pDVar1 = this->d;
    if (pDVar1 == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar4)) {
      if (pDVar1 == (Data *)0x0) {
        lVar13 = 0;
        lVar12 = 0;
      }
      else {
        lVar13 = (pDVar1->super_QArrayData).alloc;
        lVar12 = (this->size - (pDVar1->super_QArrayData).alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 4) * -0x5555555555555555;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::QMovableArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration>::reallocate
                  ((QMovableArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)this,
                   lVar13 + n + lVar12,Grow);
        return;
      }
      goto LAB_003ac3bd;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (NamespaceDeclaration *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (NamespaceDeclaration *)0x0)) {
    if (this->size != 0) {
      lVar13 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar4 = true;
      }
      else {
        bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      pNVar10 = this->ptr;
      pNVar11 = pNVar10 + lVar13;
      if ((old != (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x0) ||
         (bVar4)) {
        if ((lVar13 != 0) && (0 < lVar13)) {
          pNVar14 = local_38.ptr + local_38.size;
          do {
            pQVar5 = (pNVar10->prefix).m_string;
            qVar6 = (pNVar10->prefix).m_pos;
            qVar7 = (pNVar10->prefix).m_size;
            pQVar8 = (pNVar10->namespaceUri).m_string;
            qVar9 = (pNVar10->namespaceUri).m_size;
            (pNVar14->namespaceUri).m_pos = (pNVar10->namespaceUri).m_pos;
            (pNVar14->namespaceUri).m_size = qVar9;
            (pNVar14->prefix).m_size = qVar7;
            (pNVar14->namespaceUri).m_string = pQVar8;
            (pNVar14->prefix).m_string = pQVar5;
            (pNVar14->prefix).m_pos = qVar6;
            pNVar10 = pNVar10 + 1;
            local_38.size = local_38.size + 1;
            pNVar14 = pNVar14 + 1;
          } while (pNVar10 < pNVar11);
        }
      }
      else if ((lVar13 != 0) && (0 < lVar13)) {
        pNVar14 = local_38.ptr + local_38.size;
        do {
          pQVar5 = (pNVar10->prefix).m_string;
          qVar6 = (pNVar10->prefix).m_pos;
          qVar7 = (pNVar10->prefix).m_size;
          pQVar8 = (pNVar10->namespaceUri).m_string;
          qVar9 = (pNVar10->namespaceUri).m_size;
          (pNVar14->namespaceUri).m_pos = (pNVar10->namespaceUri).m_pos;
          (pNVar14->namespaceUri).m_size = qVar9;
          (pNVar14->prefix).m_size = qVar7;
          (pNVar14->namespaceUri).m_string = pQVar8;
          (pNVar14->prefix).m_string = pQVar5;
          (pNVar14->prefix).m_pos = qVar6;
          pNVar10 = pNVar10 + 1;
          local_38.size = local_38.size + 1;
          pNVar14 = pNVar14 + 1;
        } while (pNVar10 < pNVar11);
      }
    }
    pQVar2 = &this->d->super_QArrayData;
    pNVar10 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar3 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar2;
    local_38.ptr = pNVar10;
    local_38.size = (qsizetype)puVar3;
    if (old != (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = (Data *)pQVar2;
      old->ptr = pNVar10;
      local_38.size = old->size;
      old->size = (qsizetype)puVar3;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x30,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
LAB_003ac3bd:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }